

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.hpp
# Opt level: O3

Octant * __thiscall
unibn::Octree<CustomPoint,_std::vector<CustomPoint,_std::allocator<CustomPoint>_>_>::createOctant
          (Octree<CustomPoint,_std::vector<CustomPoint,_std::allocator<CustomPoint>_>_> *this,
          float x,float y,float z,float extent,uint32_t startIdx,uint32_t endIdx,uint32_t size)

{
  float fVar1;
  int iVar2;
  uint32_t size_00;
  vector<CustomPoint,_std::allocator<CustomPoint>_> *pvVar3;
  pointer pCVar4;
  pointer puVar5;
  Octant *pOVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  Octant *pOVar10;
  uint32_t *puVar11;
  uint32_t i;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  pointer puVar16;
  bool bVar17;
  
  uVar13 = (ulong)startIdx;
  pOVar6 = (Octant *)operator_new(0x60);
  pOVar6->child[0] = (Octant *)0x0;
  pOVar6->child[1] = (Octant *)0x0;
  pOVar6->child[2] = (Octant *)0x0;
  pOVar6->child[3] = (Octant *)0x0;
  pOVar6->child[4] = (Octant *)0x0;
  pOVar6->child[5] = (Octant *)0x0;
  pOVar6->child[6] = (Octant *)0x0;
  pOVar6->child[7] = (Octant *)0x0;
  pOVar6->isLeaf = true;
  pOVar6->x = x;
  pOVar6->y = y;
  pOVar6->z = z;
  pOVar6->extent = extent;
  pOVar6->start = startIdx;
  pOVar6->end = endIdx;
  pOVar6->size = size;
  if (((this->params_).bucketSize < size) &&
     (fVar1 = (this->params_).minExtent, fVar1 + fVar1 < extent)) {
    pOVar6->isLeaf = false;
    pvVar3 = this->data_;
    puVar7 = (undefined8 *)operator_new(0x20);
    *puVar7 = 0;
    puVar7[1] = 0;
    puVar7[2] = 0;
    puVar7[3] = 0;
    puVar8 = (undefined8 *)operator_new(0x20);
    puVar8[2] = 0;
    puVar8[3] = 0;
    *puVar8 = 0;
    puVar8[1] = 0;
    puVar9 = (undefined8 *)operator_new(0x20);
    puVar9[2] = 0;
    puVar9[3] = 0;
    *puVar9 = 0;
    puVar9[1] = 0;
    pCVar4 = (pvVar3->super__Vector_base<CustomPoint,_std::allocator<CustomPoint>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->successors_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      bVar17 = x < pCVar4[uVar13].x;
      uVar14 = bVar17 + 2;
      if (pCVar4[uVar13].y <= y) {
        uVar14 = (uint)bVar17;
      }
      uVar12 = uVar14 + 4;
      if (pCVar4[uVar13].z <= z) {
        uVar12 = uVar14;
      }
      uVar15 = (ulong)uVar12;
      iVar2 = *(int *)((long)puVar9 + uVar15 * 4);
      if (iVar2 == 0) {
        puVar16 = (pointer)((long)puVar7 + uVar15 * 4);
      }
      else {
        puVar16 = puVar5 + *(uint *)((long)puVar8 + uVar15 * 4);
      }
      *puVar16 = (uint)uVar13;
      *(int *)((long)puVar9 + (ulong)(uVar12 << 2)) = iVar2 + 1;
      *(uint *)((long)puVar8 + (ulong)(uVar12 << 2)) = (uint)uVar13;
      uVar13 = (ulong)puVar5[uVar13];
      size = size - 1;
    } while (size != 0);
    bVar17 = true;
    uVar13 = 0;
    uVar14 = 0;
    do {
      size_00 = *(uint32_t *)((long)puVar9 + uVar13 * 4);
      if (size_00 != 0) {
        uVar12 = (uint)uVar13;
        pOVar10 = createOctant(this,createOctant::factor[uVar12 & 1] * extent + x,
                               *(float *)((long)createOctant::factor + (ulong)(uVar12 & 2) * 2) *
                               extent + y,createOctant::factor[3 < uVar13] * extent + z,extent * 0.5
                               ,*(uint32_t *)((long)puVar7 + uVar13 * 4),
                               *(uint32_t *)((long)puVar8 + uVar13 * 4),size_00);
        pOVar6->child[uVar13] = pOVar10;
        puVar11 = &pOVar6->start;
        if (!bVar17) {
          puVar11 = (this->successors_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start + pOVar6->child[uVar14]->end;
        }
        *puVar11 = pOVar10->start;
        pOVar6->end = pOVar10->end;
        bVar17 = false;
        uVar14 = uVar12;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != 8);
    operator_delete(puVar9,0x20);
    operator_delete(puVar8,0x20);
    operator_delete(puVar7,0x20);
  }
  return pOVar6;
}

Assistant:

typename Octree<PointT, ContainerT>::Octant* Octree<PointT, ContainerT>::createOctant(float x, float y, float z,
                                                                                      float extent, uint32_t startIdx,
                                                                                      uint32_t endIdx, uint32_t size)
{
  // For a leaf we don't have to change anything; points are already correctly linked or correctly reordered.
  Octant* octant = new Octant;

  octant->isLeaf = true;

  octant->x = x;
  octant->y = y;
  octant->z = z;
  octant->extent = extent;

  octant->start = startIdx;
  octant->end = endIdx;
  octant->size = size;

  static const float factor[] = {-0.5f, 0.5f};

  // subdivide subset of points and re-link points according to Morton codes
  if (size > params_.bucketSize && extent > 2 * params_.minExtent)
  {
    octant->isLeaf = false;

    const ContainerT& points = *data_;
    std::vector<uint32_t> childStarts(8, 0);
    std::vector<uint32_t> childEnds(8, 0);
    std::vector<uint32_t> childSizes(8, 0);

    // re-link disjoint child subsets...
    uint32_t idx = startIdx;

    for (uint32_t i = 0; i < size; ++i)
    {
      const PointT& p = points[idx];

      // determine Morton code for each point...
      uint32_t mortonCode = 0;
      if (get<0>(p) > x) mortonCode |= 1;
      if (get<1>(p) > y) mortonCode |= 2;
      if (get<2>(p) > z) mortonCode |= 4;

      // set child starts and update successors...
      if (childSizes[mortonCode] == 0)
        childStarts[mortonCode] = idx;
      else
        successors_[childEnds[mortonCode]] = idx;
      childSizes[mortonCode] += 1;

      childEnds[mortonCode] = idx;
      idx = successors_[idx];
    }

    // now, we can create the child nodes...
    float childExtent = 0.5f * extent;
    bool firsttime = true;
    uint32_t lastChildIdx = 0;
    for (uint32_t i = 0; i < 8; ++i)
    {
      if (childSizes[i] == 0) continue;

      float childX = x + factor[(i & 1) > 0] * extent;
      float childY = y + factor[(i & 2) > 0] * extent;
      float childZ = z + factor[(i & 4) > 0] * extent;

      octant->child[i] = createOctant(childX, childY, childZ, childExtent, childStarts[i], childEnds[i], childSizes[i]);

      if (firsttime)
        octant->start = octant->child[i]->start;
      else
        successors_[octant->child[lastChildIdx]->end] =
            octant->child[i]->start;  // we have to ensure that also the child ends link to the next child start.

      lastChildIdx = i;
      octant->end = octant->child[i]->end;
      firsttime = false;
    }
  }

  return octant;
}